

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<slang::ast::Compilation::resolveDefParamsAndBinds()::BindEntry>::
emplace_back<slang::ast::Compilation::resolveDefParamsAndBinds()::BindEntry>
          (SmallVectorBase<slang::ast::Compilation::resolveDefParamsAndBinds()::BindEntry> *this,
          BindEntry *args)

{
  undefined8 *puVar1;
  SyntaxNode **ppSVar2;
  ulong uVar3;
  ulong uVar4;
  ModuleDeclarationSyntax *pMVar5;
  BindDirectiveSyntax *pBVar6;
  SyntaxNode *pSVar7;
  SyntaxNode *pSVar8;
  SyntaxNode *pSVar9;
  pointer ppSVar10;
  undefined8 uVar11;
  reference pBVar12;
  reference extraout_RAX;
  BindEntry *ctx;
  BindEntry *pBVar13;
  BindEntry *pBVar14;
  BindEntry *this_00;
  reference pBVar15;
  ulong uVar16;
  
  uVar3 = *(ulong *)(this + 8);
  uVar4 = *(ulong *)(this + 0x10);
  this_00 = (BindEntry *)(*(long *)this + uVar3 * 0x80);
  if (uVar3 == uVar4) {
    if (uVar3 == 0xffffffffffffff) {
      detail::throwLengthError();
    }
    uVar16 = uVar3 + 1;
    if (uVar3 + 1 < uVar4 * 2) {
      uVar16 = uVar4 * 2;
    }
    if (0xffffffffffffff - uVar4 < uVar4) {
      uVar16 = 0xffffffffffffff;
    }
    pBVar12 = (reference)operator_new(uVar16 << 7);
    ctx = args;
    SmallVector<slang::ast::OpaqueInstancePath::Entry,_5UL>::SmallVector
              ((SmallVector<slang::ast::OpaqueInstancePath::Entry,_5UL> *)(pBVar12 + uVar3),
               (Base *)args);
    pMVar5 = args->definitionTarget;
    pBVar6 = (args->info).bindSyntax;
    pSVar7 = (args->info).configRuleSyntax;
    pSVar8 = (args->info).configBlockSyntax;
    pSVar9 = (args->info).instantiationDefSyntax;
    ppSVar10 = (args->info).liblist._M_ptr;
    uVar11 = *(undefined8 *)((long)&(args->info).liblist._M_extent._M_extent_value + 1);
    puVar1 = (undefined8 *)((long)&pBVar12[uVar3].info.liblist._M_ptr + 1);
    *puVar1 = *(undefined8 *)((long)&(args->info).liblist._M_ptr + 1);
    puVar1[1] = uVar11;
    ppSVar2 = &pBVar12[uVar3].info.instantiationDefSyntax;
    *ppSVar2 = pSVar9;
    ((span<const_slang::SourceLibrary_*const,_18446744073709551615UL> *)(ppSVar2 + 1))->_M_ptr =
         ppSVar10;
    ppSVar2 = &pBVar12[uVar3].info.configRuleSyntax;
    *ppSVar2 = pSVar7;
    ppSVar2[1] = pSVar8;
    pBVar12[uVar3].definitionTarget = pMVar5;
    ((BindDirectiveInfo *)(&pBVar12[uVar3].definitionTarget + 1))->bindSyntax = pBVar6;
    pBVar14 = *(BindEntry **)this;
    pBVar13 = pBVar14 + *(long *)(this + 8);
    pBVar15 = pBVar12;
    if (pBVar13 == this_00) {
      if (*(long *)(this + 8) != 0) {
        do {
          ctx = pBVar14;
          SmallVector<slang::ast::OpaqueInstancePath::Entry,_5UL>::SmallVector
                    ((SmallVector<slang::ast::OpaqueInstancePath::Entry,_5UL> *)pBVar15,
                     (Base *)pBVar14);
          pMVar5 = pBVar14->definitionTarget;
          pBVar6 = (pBVar14->info).bindSyntax;
          pSVar7 = (pBVar14->info).configRuleSyntax;
          pSVar8 = (pBVar14->info).configBlockSyntax;
          pSVar9 = (pBVar14->info).instantiationDefSyntax;
          ppSVar10 = (pBVar14->info).liblist._M_ptr;
          uVar11 = *(undefined8 *)((long)&(pBVar14->info).liblist._M_extent._M_extent_value + 1);
          *(undefined8 *)((long)&(pBVar15->info).liblist._M_ptr + 1) =
               *(undefined8 *)((long)&(pBVar14->info).liblist._M_ptr + 1);
          *(undefined8 *)((long)&(pBVar15->info).liblist._M_extent._M_extent_value + 1) = uVar11;
          (pBVar15->info).instantiationDefSyntax = pSVar9;
          (pBVar15->info).liblist._M_ptr = ppSVar10;
          (pBVar15->info).configRuleSyntax = pSVar7;
          (pBVar15->info).configBlockSyntax = pSVar8;
          pBVar15->definitionTarget = pMVar5;
          (pBVar15->info).bindSyntax = pBVar6;
          pBVar14 = pBVar14 + 1;
          pBVar15 = pBVar15 + 1;
        } while (pBVar14 != pBVar13);
      }
    }
    else {
      for (; pBVar14 != this_00; pBVar14 = pBVar14 + 1) {
        ctx = pBVar14;
        SmallVector<slang::ast::OpaqueInstancePath::Entry,_5UL>::SmallVector
                  ((SmallVector<slang::ast::OpaqueInstancePath::Entry,_5UL> *)pBVar15,
                   (Base *)pBVar14);
        pMVar5 = pBVar14->definitionTarget;
        pBVar6 = (pBVar14->info).bindSyntax;
        pSVar7 = (pBVar14->info).configRuleSyntax;
        pSVar8 = (pBVar14->info).configBlockSyntax;
        pSVar9 = (pBVar14->info).instantiationDefSyntax;
        ppSVar10 = (pBVar14->info).liblist._M_ptr;
        uVar11 = *(undefined8 *)((long)&(pBVar14->info).liblist._M_extent._M_extent_value + 1);
        *(undefined8 *)((long)&(pBVar15->info).liblist._M_ptr + 1) =
             *(undefined8 *)((long)&(pBVar14->info).liblist._M_ptr + 1);
        *(undefined8 *)((long)&(pBVar15->info).liblist._M_extent._M_extent_value + 1) = uVar11;
        (pBVar15->info).instantiationDefSyntax = pSVar9;
        (pBVar15->info).liblist._M_ptr = ppSVar10;
        (pBVar15->info).configRuleSyntax = pSVar7;
        (pBVar15->info).configBlockSyntax = pSVar8;
        pBVar15->definitionTarget = pMVar5;
        (pBVar15->info).bindSyntax = pBVar6;
        pBVar15 = pBVar15 + 1;
      }
      pBVar14 = (BindEntry *)(*(long *)(this + 8) * 0x80 + *(long *)this);
      if (pBVar14 != this_00) {
        pBVar15 = pBVar12 + uVar3;
        do {
          ctx = this_00;
          SmallVector<slang::ast::OpaqueInstancePath::Entry,_5UL>::SmallVector
                    ((SmallVector<slang::ast::OpaqueInstancePath::Entry,_5UL> *)(pBVar15 + 1),
                     (Base *)this_00);
          pMVar5 = this_00->definitionTarget;
          pBVar6 = (this_00->info).bindSyntax;
          pSVar7 = (this_00->info).configRuleSyntax;
          pSVar8 = (this_00->info).configBlockSyntax;
          pSVar9 = (this_00->info).instantiationDefSyntax;
          ppSVar10 = (this_00->info).liblist._M_ptr;
          uVar11 = *(undefined8 *)((long)&(this_00->info).liblist._M_extent._M_extent_value + 1);
          *(undefined8 *)((long)&pBVar15[1].info.liblist._M_ptr + 1) =
               *(undefined8 *)((long)&(this_00->info).liblist._M_ptr + 1);
          *(undefined8 *)((long)&pBVar15[1].info.liblist._M_extent._M_extent_value + 1) = uVar11;
          pBVar15[1].info.instantiationDefSyntax = pSVar9;
          pBVar15[1].info.liblist._M_ptr = ppSVar10;
          pBVar15[1].info.configRuleSyntax = pSVar7;
          pBVar15[1].info.configBlockSyntax = pSVar8;
          pBVar15[1].definitionTarget = pMVar5;
          pBVar15[1].info.bindSyntax = pBVar6;
          this_00 = this_00 + 1;
          pBVar15 = pBVar15 + 1;
        } while (this_00 != pBVar14);
      }
    }
    SmallVectorBase<BindEntry>::cleanup((SmallVectorBase<BindEntry> *)this,(EVP_PKEY_CTX *)ctx);
    *(long *)(this + 8) = *(long *)(this + 8) + 1;
    *(ulong *)(this + 0x10) = uVar16;
    *(reference *)this = pBVar12;
  }
  else {
    SmallVector<slang::ast::OpaqueInstancePath::Entry,_5UL>::SmallVector
              ((SmallVector<slang::ast::OpaqueInstancePath::Entry,_5UL> *)this_00,(Base *)args);
    pMVar5 = args->definitionTarget;
    pBVar6 = (args->info).bindSyntax;
    pSVar7 = (args->info).configRuleSyntax;
    pSVar8 = (args->info).configBlockSyntax;
    pSVar9 = (args->info).instantiationDefSyntax;
    ppSVar10 = (args->info).liblist._M_ptr;
    uVar11 = *(undefined8 *)((long)&(args->info).liblist._M_extent._M_extent_value + 1);
    *(undefined8 *)((long)&(this_00->info).liblist._M_ptr + 1) =
         *(undefined8 *)((long)&(args->info).liblist._M_ptr + 1);
    *(undefined8 *)((long)&(this_00->info).liblist._M_extent._M_extent_value + 1) = uVar11;
    (this_00->info).instantiationDefSyntax = pSVar9;
    (this_00->info).liblist._M_ptr = ppSVar10;
    (this_00->info).configRuleSyntax = pSVar7;
    (this_00->info).configBlockSyntax = pSVar8;
    this_00->definitionTarget = pMVar5;
    (this_00->info).bindSyntax = pBVar6;
    *(long *)(this + 8) = *(long *)(this + 8) + 1;
    pBVar12 = extraout_RAX;
  }
  return pBVar12;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }